

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O1

cupdlp_retcode
dense_alloc_matrix(CUPDLPdense *dense,cupdlp_int nRows,cupdlp_int nCols,void *src,
                  CUPDLP_MATRIX_FORMAT src_matrix_format)

{
  undefined8 uVar1;
  cupdlp_float *__dest;
  cupdlp_retcode cVar2;
  cupdlp_retcode cVar3;
  
  __dest = (cupdlp_float *)calloc((long)(nRows * nCols),8);
  dense->data = __dest;
  if (__dest == (cupdlp_float *)0x0) {
    cVar3 = 1;
  }
  else {
    cVar2 = 0;
    cVar3 = cVar2;
    if (src_matrix_format == CSC) {
      csc2dense(dense,(CUPDLPcsc *)src);
    }
    else if (src_matrix_format == CSR) {
      csr2dense(dense,(CUPDLPcsr *)src);
    }
    else {
      cVar3 = 0;
      if (src_matrix_format == DENSE) {
        uVar1 = *src;
        dense->nRows = (int)uVar1;
        dense->nCols = (int)((ulong)uVar1 >> 0x20);
        memcpy(__dest,*(void **)((long)src + 8),(long)*(int *)((long)src + 4) * (long)*src * 8);
        cVar3 = cVar2;
      }
    }
  }
  return cVar3;
}

Assistant:

cupdlp_retcode dense_alloc_matrix(CUPDLPdense *dense, cupdlp_int nRows,
                                  cupdlp_int nCols, void *src,
                                  CUPDLP_MATRIX_FORMAT src_matrix_format) {
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_init_zero_vec_double(dense->data, nRows * nCols);

  switch (src_matrix_format) {
    case DENSE:
      dense_copy(dense, (CUPDLPdense *)src);
      break;
    case CSR:
      csr2dense(dense, (CUPDLPcsr *)src);
      break;
    case CSC:
      csc2dense(dense, (CUPDLPcsc *)src);
      break;
    default:
      break;
  }
exit_cleanup:
  return retcode;
}